

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  pointer pcVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  undefined7 extraout_var;
  long *plVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  size_type *psVar10;
  pointer pbVar11;
  undefined1 *puVar12;
  undefined4 uVar13;
  size_type sVar14;
  ulong uVar15;
  string e_2;
  string input;
  string output;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  replacement;
  RegularExpression re;
  undefined1 local_210 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  cmCommand *local_1d0;
  undefined4 local_1c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1a0;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  undefined1 local_148 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108 [13];
  char *local_a0;
  char *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  pointer local_80;
  char *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __rhs = pbVar11 + 3;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = &this->super_cmCommand;
  local_1a0 = args;
  if (pbVar11[3]._M_string_length != 0) {
    pcVar1 = local_148 + 8;
    sVar14 = 0;
    do {
      uVar5 = std::__cxx11::string::find((char)__rhs,0x5c);
      if (uVar5 != 0xffffffffffffffff) {
        if (uVar5 != sVar14) {
          std::__cxx11::string::substr((ulong)&local_1f0,(ulong)__rhs);
          local_158._0_4_ = 0xffffffff;
          local_150._M_p = pcVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,local_1f0._M_allocated_capacity,
                     local_1f0._8_8_ + local_1f0._M_allocated_capacity);
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::emplace_back<cmStringCommand::RegexReplacement>
                    (&local_198,(RegexReplacement *)local_158);
          if (local_150._M_p != pcVar1) {
            operator_delete(local_150._M_p,CONCAT71(local_148._9_7_,local_148[8]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_allocated_capacity != &local_1e0) {
            operator_delete((void *)local_1f0._M_allocated_capacity,
                            local_1e0._M_allocated_capacity + 1);
          }
        }
        if (uVar5 == pbVar11[3]._M_string_length - 1) {
          local_158 = (undefined1  [8])local_148;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,
                     "sub-command REGEX, mode REPLACE: replace-expression ends in a backslash.","");
          cmCommand::SetError(local_1d0,(string *)local_158);
          if (local_158 != (undefined1  [8])local_148) {
LAB_0031397c:
            operator_delete((void *)local_158,(ulong)(local_148._0_8_ + 1));
          }
        }
        else {
          bVar4 = (__rhs->_M_dataplus)._M_p[uVar5 + 1];
          if (0x2f < (char)bVar4) {
            if (bVar4 < 0x3a) {
              local_158._0_4_ = (char)bVar4 + -0x30;
              local_148._0_8_ = (pointer)0x0;
              local_148[8] = '\0';
              local_150._M_p = pcVar1;
              std::
              vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ::emplace_back<cmStringCommand::RegexReplacement>
                        (&local_198,(RegexReplacement *)local_158);
            }
            else if (bVar4 == 0x5c) {
              local_158._0_4_ = 0xffffffff;
              local_150._M_p = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"\\","");
              std::
              vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ::emplace_back<cmStringCommand::RegexReplacement>
                        (&local_198,(RegexReplacement *)local_158);
            }
            else {
              if (bVar4 != 0x6e) goto LAB_003138d9;
              local_158._0_4_ = 0xffffffff;
              local_150._M_p = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"\n","");
              std::
              vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ::emplace_back<cmStringCommand::RegexReplacement>
                        (&local_198,(RegexReplacement *)local_158);
            }
            if (local_150._M_p != pcVar1) {
              operator_delete(local_150._M_p,CONCAT71(local_148._9_7_,local_148[8]) + 1);
            }
            sVar14 = uVar5 + 2;
            goto LAB_00313576;
          }
LAB_003138d9:
          local_158 = (undefined1  [8])local_148;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,"sub-command REGEX, mode REPLACE: Unknown escape \"","");
          std::__cxx11::string::substr((ulong)&local_1f0,(ulong)__rhs);
          std::__cxx11::string::_M_append(local_158,local_1f0._M_allocated_capacity);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_allocated_capacity != &local_1e0) {
            operator_delete((void *)local_1f0._M_allocated_capacity,
                            local_1e0._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append(local_158);
          cmCommand::SetError(local_1d0,(string *)local_158);
          if (local_158 != (undefined1  [8])local_148) goto LAB_0031397c;
        }
        bVar4 = 0;
        goto LAB_00313bea;
      }
      sVar14 = pbVar11[3]._M_string_length;
      std::__cxx11::string::substr((ulong)&local_1f0,(ulong)__rhs);
      local_158._0_4_ = 0xffffffff;
      local_150._M_p = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_1f0._M_allocated_capacity,
                 local_1f0._8_8_ + local_1f0._M_allocated_capacity);
      std::
      vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
      ::emplace_back<cmStringCommand::RegexReplacement>(&local_198,(RegexReplacement *)local_158);
      if (local_150._M_p != pcVar1) {
        operator_delete(local_150._M_p,CONCAT71(local_148._9_7_,local_148[8]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_allocated_capacity != &local_1e0) {
        operator_delete((void *)local_1f0._M_allocated_capacity,local_1e0._M_allocated_capacity + 1)
        ;
      }
LAB_00313576:
    } while (sVar14 < pbVar11[3]._M_string_length);
  }
  cmMakefile::ClearMatches(local_1d0->Makefile);
  __rhs_00 = pbVar11 + 2;
  local_a0 = (char *)0x0;
  bVar3 = cmsys::RegularExpression::compile
                    ((RegularExpression *)local_158,(__rhs_00->_M_dataplus)._M_p);
  if (bVar3) {
    local_210._0_8_ =
         (local_1a0->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 5;
    local_210._8_8_ =
         (local_1a0->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    paVar8 = &local_1c0.field_2;
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_local_buf[0] = '\0';
    local_1c0._M_dataplus._M_p = (pointer)paVar8;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)&local_1f0,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_210,paVar8->_M_local_buf);
    local_88 = __rhs_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar8) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                               local_1c0.field_2._M_local_buf[0]) + 1);
    }
    local_80 = pbVar11 + 4;
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_local_buf[0] = '\0';
    puVar12 = (undefined1 *)0x0;
    local_1c0._M_dataplus._M_p = (pointer)paVar8;
    while( true ) {
      bVar4 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_158,puVar12 + local_1f0._M_allocated_capacity);
      if (!(bool)bVar4) break;
      cmMakefile::ClearMatches(local_1d0->Makefile);
      cmMakefile::StoreMatches(local_1d0->Makefile,(RegularExpression *)local_158);
      auVar2 = local_158;
      local_1c4 = (undefined4)CONCAT71(extraout_var,bVar4);
      local_1a0 = local_108[0];
      local_78 = local_90;
      std::__cxx11::string::substr((ulong)local_210,(ulong)&local_1f0);
      std::__cxx11::string::_M_append((char *)&local_1c0,local_210._0_8_);
      if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
        operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
      }
      if ((undefined1  [8])local_1a0 == auVar2) {
        std::operator+(&local_178,"sub-command REGEX, mode REPLACE regex \"",local_88);
        uVar13 = local_1c4;
        bVar4 = (byte)local_1c4;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
        pbVar11 = (pointer)(plVar6 + 2);
        if ((pointer)*plVar6 == pbVar11) {
          local_210._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_210._24_8_ = plVar6[3];
          local_210._0_8_ = (pointer)(local_210 + 0x10);
        }
        else {
          local_210._16_8_ = (pbVar11->_M_dataplus)._M_p;
          local_210._0_8_ = (pointer)*plVar6;
        }
        local_210._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        cmCommand::SetError(local_1d0,(string *)local_210);
        if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
LAB_00313b95:
          bVar4 = (byte)uVar13;
          operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
        }
        goto LAB_00313ba2;
      }
      if (local_198.
          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_198.
          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar5 = 0;
        uVar15 = 1;
        do {
          lVar7 = (long)local_198.
                        super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5].number;
          if (lVar7 < 0) {
            std::__cxx11::string::_M_append
                      ((char *)&local_1c0,
                       (ulong)local_198.
                              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar5].value._M_dataplus.
                              _M_p);
          }
          else {
            if ((((*(long *)(local_158 + lVar7 * 8) - (long)local_90 == 0xffffffffffffffff) ||
                 ((long)local_108[lVar7] - (long)local_90 == 0xffffffffffffffff)) ||
                ((ulong)(local_1f0._8_8_ - (long)puVar12) <
                 (ulong)(*(long *)(local_158 + lVar7 * 8) - (long)local_90))) ||
               ((ulong)(local_1f0._8_8_ - (long)puVar12) <
                (ulong)((long)local_108[lVar7] - (long)local_90))) {
              std::operator+(&local_50,"sub-command REGEX, mode REPLACE: replace expression \"",
                             __rhs);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
              plVar9 = plVar6 + 2;
              if ((long *)*plVar6 == plVar9) {
                local_60 = *plVar9;
                lStack_58 = plVar6[3];
                local_70 = &local_60;
              }
              else {
                local_60 = *plVar9;
                local_70 = (long *)*plVar6;
              }
              local_68 = plVar6[1];
              *plVar6 = (long)plVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_70,(ulong)pbVar11[2]._M_dataplus._M_p);
              psVar10 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_178.field_2._M_allocated_capacity = *psVar10;
                local_178.field_2._8_8_ = plVar6[3];
                local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              }
              else {
                local_178.field_2._M_allocated_capacity = *psVar10;
                local_178._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_178._M_string_length = plVar6[1];
              *plVar6 = (long)psVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
              pbVar11 = (pointer)(plVar6 + 2);
              if ((pointer)*plVar6 == pbVar11) {
                local_210._16_8_ = (pbVar11->_M_dataplus)._M_p;
                local_210._24_8_ = plVar6[3];
                local_210._0_8_ = (pointer)(local_210 + 0x10);
              }
              else {
                local_210._16_8_ = (pbVar11->_M_dataplus)._M_p;
                local_210._0_8_ = (pointer)*plVar6;
              }
              local_210._8_8_ = plVar6[1];
              *plVar6 = (long)pbVar11;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
              if (local_70 != &local_60) {
                operator_delete(local_70,local_60 + 1);
              }
              uVar13 = local_1c4;
              bVar4 = (byte)local_1c4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              cmCommand::SetError(local_1d0,(string *)local_210);
              if ((pointer)local_210._0_8_ == (pointer)(local_210 + 0x10)) goto LAB_00313ba2;
              goto LAB_00313b95;
            }
            std::__cxx11::string::substr((ulong)local_210,(ulong)&local_1f0);
            std::__cxx11::string::_M_append((char *)&local_1c0,local_210._0_8_);
            if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
              operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
            }
          }
          uVar5 = ((long)local_198.
                         super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          bVar3 = uVar15 <= uVar5;
          lVar7 = uVar5 - uVar15;
          uVar5 = uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar3 && lVar7 != 0);
      }
      puVar12 = (undefined1 *)(((long)puVar12 - (long)local_78) + (long)local_1a0);
    }
    std::__cxx11::string::substr((ulong)local_210,(ulong)&local_1f0);
    std::__cxx11::string::_M_append((char *)&local_1c0,local_210._0_8_);
    if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
      operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
    }
    cmMakefile::AddDefinition(local_1d0->Makefile,local_80,local_1c0._M_dataplus._M_p);
LAB_00313ba2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                               local_1c0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_allocated_capacity != &local_1e0) {
      operator_delete((void *)local_1f0._M_allocated_capacity,local_1e0._M_allocated_capacity + 1);
    }
    bVar4 = bVar4 ^ 1;
  }
  else {
    std::operator+(&local_1c0,"sub-command REGEX, mode REPLACE failed to compile regex \"",__rhs_00)
    ;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_1e0._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_1e0._8_8_ = plVar6[3];
      local_1f0._M_allocated_capacity = (size_type)&local_1e0;
    }
    else {
      local_1e0._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_1f0._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_1f0._8_8_ = plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                               local_1c0.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(local_1d0,(string *)&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_allocated_capacity != &local_1e0) {
      operator_delete((void *)local_1f0._M_allocated_capacity,local_1e0._M_allocated_capacity + 1);
    }
    bVar4 = 0;
  }
  if (local_a0 != (char *)0x0) {
    operator_delete__(local_a0);
  }
LAB_00313bea:
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::~vector(&local_198);
  return (bool)bVar4;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string const& regex = args[2];
  std::string const& replace = args[3];
  std::string const& outvar = args[4];

  // Pull apart the replace expression to find the escaped [0-9] values.
  std::vector<RegexReplacement> replacement;
  std::string::size_type l = 0;
  while (l < replace.length()) {
    std::string::size_type r = replace.find('\\', l);
    if (r == std::string::npos) {
      r = replace.length();
      replacement.push_back(replace.substr(l, r - l));
    } else {
      if (r - l > 0) {
        replacement.push_back(replace.substr(l, r - l));
      }
      if (r == (replace.length() - 1)) {
        this->SetError("sub-command REGEX, mode REPLACE: "
                       "replace-expression ends in a backslash.");
        return false;
      }
      if ((replace[r + 1] >= '0') && (replace[r + 1] <= '9')) {
        replacement.push_back(replace[r + 1] - '0');
      } else if (replace[r + 1] == 'n') {
        replacement.push_back("\n");
      } else if (replace[r + 1] == '\\') {
        replacement.push_back("\\");
      } else {
        std::string e = "sub-command REGEX, mode REPLACE: Unknown escape \"";
        e += replace.substr(r, 2);
        e += "\" in replace-expression.";
        this->SetError(e);
        return false;
      }
      r += 2;
    }
    l = r;
  }

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(5), std::string());

  // Scan through the input for all matches.
  std::string output;
  std::string::size_type base = 0;
  while (re.find(input.c_str() + base)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l2 = re.start();
    std::string::size_type r = re.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if (r - l2 == 0) {
      std::string e = "sub-command REGEX, mode REPLACE regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }

    // Concatenate the replacement for the match.
    for (unsigned int i = 0; i < replacement.size(); ++i) {
      if (replacement[i].number < 0) {
        // This is just a plain-text part of the replacement.
        output += replacement[i].value;
      } else {
        // Replace with part of the match.
        int n = replacement[i].number;
        std::string::size_type start = re.start(n);
        std::string::size_type end = re.end(n);
        std::string::size_type len = input.length() - base;
        if ((start != std::string::npos) && (end != std::string::npos) &&
            (start <= len) && (end <= len)) {
          output += input.substr(base + start, end - start);
        } else {
          std::string e =
            "sub-command REGEX, mode REPLACE: replace expression \"" +
            replace + "\" contains an out-of-range escape for regex \"" +
            regex + "\".";
          this->SetError(e);
          return false;
        }
      }
    }

    // Move past the match.
    base += r;
  }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length() - base);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}